

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O1

SNMP_ERROR_RESPONSE __thiscall SNMPAgent::loop(SNMPAgent *this)

{
  handle_inform_queue((list<InformItem_*,_std::allocator<InformItem_*>_> *)(this + 0x648));
  return SNMP_NO_PACKET;
}

Assistant:

SNMP_ERROR_RESPONSE SNMPAgent::loop(){
    for(auto udp : _udp){
        int packetLength = udp->parsePacket();
        if(packetLength > 0){
            SNMP_LOGD("Received packet from: %s, of size: %d", udp->remoteIP().toString().c_str(), packetLength);

            if(packetLength < 0 || packetLength > MAX_SNMP_PACKET_LENGTH){
                SNMP_LOGW("Incoming packet too large: %d\n", packetLength);
                return SNMP_REQUEST_TOO_LARGE;
            }

            memset(_packetBuffer, 0, MAX_SNMP_PACKET_LENGTH);

            int readBytes = udp->read(_packetBuffer, packetLength);
            if(readBytes != packetLength){
                SNMP_LOGW("Packet length mismatch: expected: %d, actual: %d\n", packetLength, readBytes);
                return SNMP_REQUEST_INVALID;
            }

            int responseLength = 0;
            SNMP_ERROR_RESPONSE response = handlePacket(_packetBuffer, packetLength, &responseLength, MAX_SNMP_PACKET_LENGTH, callbacks, _community, _readOnlyCommunity, informCallback, (void*)this);
            if(response > 0 && response != SNMP_INFORM_RESPONSE_OCCURRED){
                // send it
                SNMP_LOGD("Built packet, sending back response to: %s, %d\n", udp->remoteIP().toString().c_str(), udp->remotePort());
                udp->beginPacket(udp->remoteIP(), udp->remotePort());
                udp->write(_packetBuffer, responseLength);

                if(!udp->endPacket()){
                    SNMP_LOGW("Failed to send response packet\n");
                }
            }

            if(response == SNMP_SET_OCCURRED){
                setOccurred = true;
            }

            this->handleInformQueue();
            return response;
        }
    }
    
    this->handleInformQueue();
    return SNMP_NO_PACKET;
}